

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateTemplateNode::TemplateTemplateNode
          (TemplateTemplateNode *this,TemplateToken *token,Strip strip,string *indentation)

{
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *this_00;
  pointer *ppMVar1;
  size_t sVar2;
  pointer pcVar3;
  iterator __position;
  char *pcVar4;
  undefined4 uVar5;
  TemplateId TVar6;
  ModifierAndValue local_48;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR__TemplateTemplateNode_0014e248;
  uVar5 = *(undefined4 *)&token->field_0x4;
  pcVar4 = token->text;
  (this->token_).type = token->type;
  *(undefined4 *)&(this->token_).field_0x4 = uVar5;
  (this->token_).text = pcVar4;
  (this->token_).textlen = token->textlen;
  this_00 = &(this->token_).modvals;
  std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::vector
            (this_00,&token->modvals);
  sVar2 = (this->token_).textlen;
  (this->variable_).super_TemplateString.ptr_ = (this->token_).text;
  (this->variable_).super_TemplateString.length_ = sVar2;
  (this->variable_).super_TemplateString.is_immutable_ = false;
  (this->variable_).super_TemplateString.id_ = 0;
  TVar6 = TemplateString::GetGlobalId(&(this->variable_).super_TemplateString);
  (this->variable_).super_TemplateString.id_ = TVar6;
  this->strip_ = strip;
  (this->indentation_)._M_dataplus._M_p = (pointer)&(this->indentation_).field_2;
  pcVar3 = (indentation->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->indentation_,pcVar3,pcVar3 + indentation->_M_string_length);
  local_48.value_len = (this->indentation_)._M_string_length;
  if (local_48.value_len != 0) {
    local_48.value = (this->indentation_)._M_dataplus._M_p;
    local_48.modifier_info = (ModifierInfo *)(anonymous_namespace)::g_prefix_line_info;
    __position._M_current =
         (this->token_).modvals.
         super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->token_).modvals.
        super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
      _M_realloc_insert<ctemplate::ModifierAndValue>(this_00,__position,&local_48);
    }
    else {
      (__position._M_current)->value_len = local_48.value_len;
      (__position._M_current)->modifier_info =
           (ModifierInfo *)(anonymous_namespace)::g_prefix_line_info;
      (__position._M_current)->value = local_48.value;
      ppMVar1 = &(this->token_).modvals.
                 super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
  }
  return;
}

Assistant:

explicit TemplateTemplateNode(const TemplateToken& token, Strip strip,
                                const string& indentation)
      : token_(token),
        variable_(token_.text, token_.textlen),
        strip_(strip), indentation_(indentation) {
    VLOG(2) << "Constructing TemplateTemplateNode: "
            << string(token_.text, token_.textlen) << endl;

    // If this template is indented (eg, " {{>SUBTPL}}"), make sure
    // every line of the expanded template is indented, not just the
    // first one.  We do this by adding a modifier that applies to
    // the entire template node, that inserts spaces after newlines.
    if (!indentation_.empty()) {
      token_.modvals.push_back(ModifierAndValue(&g_prefix_line_info,
                                                indentation_.data(),
                                                indentation_.length()));
    }
  }